

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
Chainstate::ConnectBlock
          (Chainstate *this,CBlock *block,BlockValidationState *state,CBlockIndex *pindex,
          CCoinsViewCache *view,bool fJustCheck)

{
  uint uVar1;
  ConstevalStringLiteral str;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BlockValidationResult BVar6;
  CBlockIndex *pCVar7;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *pvVar8;
  ulong uVar9;
  size_type sVar10;
  Coin *pCVar11;
  uint *puVar12;
  int64_t iVar13;
  CAmount CVar14;
  type tVar15;
  type tVar16;
  CBlockIndex *in_RCX;
  long in_RDI;
  ValidationCache *in_R8;
  byte in_R9B;
  long in_FS_OFFSET;
  _List_node_base *p_Var17;
  rep_conflict rVar18;
  _func_int **flag;
  undefined1 auVar19 [16];
  pair<std::_Rb_tree_const_iterator<CBlockIndex_*>,_bool> pVar20;
  bool fCacheResults;
  size_t j;
  CTransaction *tx_1;
  uint i;
  int64_t nSigOpsCost;
  int nInputs;
  uint flags;
  int nLockTimeFlags;
  size_t o;
  shared_ptr<const_CTransaction> *tx;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *__range2;
  CBlockIndex *pindexBIP34height;
  bool fEnforceBIP30;
  bool fScriptChecks;
  CChainParams *params;
  bool parallel_script_checks;
  time_point time_6;
  time_point time_5;
  time_point time_4;
  CAmount blockReward;
  time_point time_3;
  CTxUndo undoDummy;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> vChecks;
  CAmount txfee;
  CAmount nFees;
  vector<int,_std::allocator<int>_> prevheights;
  vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_> txsdata;
  CBlockUndo blockundo;
  time_point time_2;
  const_iterator __end2;
  const_iterator __begin2;
  time_point time_1;
  const_iterator it;
  time_point time_start;
  CCheckQueueControl<CScriptCheck> control;
  TxValidationState tx_state_1;
  TxValidationState tx_state;
  uint256 hashPrevBlock;
  uint256 block_hash;
  ChainstateManager *in_stack_fffffffffffff198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  undefined4 uVar22;
  char *in_stack_fffffffffffff1a0;
  char *pcVar23;
  CCoinsViewCache *in_stack_fffffffffffff1a8;
  ChainstateManager *in_stack_fffffffffffff1b0;
  Params *in_stack_fffffffffffff1b8;
  CBlockIndex *in_stack_fffffffffffff1c0;
  CBlockIndex *in_stack_fffffffffffff1c8;
  CCoinsViewCache *in_stack_fffffffffffff1d0;
  CTransaction *in_stack_fffffffffffff1d8;
  undefined4 in_stack_fffffffffffff1e0;
  uint32_t in_stack_fffffffffffff1e4;
  undefined7 in_stack_fffffffffffff1e8;
  undefined1 in_stack_fffffffffffff1ef;
  CTransaction *in_stack_fffffffffffff1f0;
  LogFlags in_stack_fffffffffffff200;
  undefined8 in_stack_fffffffffffff208;
  int iVar24;
  undefined7 in_stack_fffffffffffff228;
  undefined1 in_stack_fffffffffffff22f;
  BlockValidationState *in_stack_fffffffffffff230;
  undefined7 in_stack_fffffffffffff238;
  undefined1 in_stack_fffffffffffff23f;
  BlockManager *in_stack_fffffffffffff240;
  _Head_base<0UL,_Chainstate_*,_false> in_stack_fffffffffffff248;
  _Head_base<0UL,_Chainstate_*,_false> in_stack_fffffffffffff250;
  type in_stack_fffffffffffff258;
  undefined4 in_stack_fffffffffffff260;
  int in_stack_fffffffffffff264;
  undefined4 uVar25;
  CCoinsViewCache *in_stack_fffffffffffff268;
  undefined7 in_stack_fffffffffffff270;
  undefined1 in_stack_fffffffffffff277;
  CTransaction *in_stack_fffffffffffff278;
  undefined8 in_stack_fffffffffffff280;
  CCoinsViewCache *in_stack_fffffffffffff288;
  TxValidationState *in_stack_fffffffffffff290;
  CTransaction *in_stack_fffffffffffff298;
  undefined8 in_stack_fffffffffffff2a0;
  undefined2 uVar26;
  Params *in_stack_fffffffffffff2a8;
  undefined7 in_stack_fffffffffffff2b0;
  undefined1 in_stack_fffffffffffff2b7;
  CBlock *in_stack_fffffffffffff2b8;
  undefined8 in_stack_fffffffffffff2d0;
  Level LVar27;
  undefined8 in_stack_fffffffffffff340;
  type in_stack_fffffffffffff350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff360;
  type in_stack_fffffffffffff368;
  _Head_base<0UL,_Chainstate_*,_false> in_stack_fffffffffffff370;
  CCoinsViewCache *local_c40;
  PrecomputedTransactionData *in_stack_fffffffffffff4f0;
  ValidationCache *in_stack_fffffffffffff4f8;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *in_stack_fffffffffffff500;
  byte local_af1;
  byte local_ae1;
  ulong local_9e0;
  uint local_9b4;
  long local_9b0;
  int local_9a4;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *local_980;
  byte local_8e9;
  undefined1 local_8c8 [72];
  _List_node_base *local_880;
  undefined1 local_878 [48];
  ListNode *local_848;
  ListNode *local_840;
  _Base_ptr local_838;
  _Base_ptr local_830;
  _Base_ptr local_828;
  ListNode *local_820;
  ListNode *local_818;
  undefined1 local_810 [48];
  _Base_ptr local_7e0;
  _Base_ptr local_7d8;
  allocator<char> local_7ca;
  allocator<char> local_7c9 [39];
  allocator<char> local_7a2;
  allocator<char> local_7a1;
  undefined1 local_7a0 [64];
  _Base_ptr local_760;
  _List_node_base *local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_750;
  PoolAllocator<std::__detail::_Hash_node<std::pair<const_COutPoint,_CCoinsCacheEntry>,_false>,_144UL,_8UL>
  local_748;
  undefined1 local_740 [48];
  _Base_ptr local_710;
  _Base_ptr local_708;
  undefined1 local_6c8 [71];
  allocator<char> local_681 [39];
  allocator<char> local_65a;
  allocator<char> local_659 [65];
  _Base_ptr local_618;
  _Base_ptr local_610;
  _Base_ptr local_5b8;
  _Base_ptr local_5b0;
  _Base_ptr local_5a8;
  undefined1 local_5a0 [56];
  _Base_ptr local_568;
  allocator<char> local_55a;
  allocator<char> local_559 [33];
  _Base_ptr local_538;
  __node_base local_530;
  _Base_ptr local_528;
  _Base_ptr local_520;
  _Base_ptr local_518;
  undefined1 local_510 [48];
  _Base_ptr local_4e0;
  _Base_ptr local_4d8;
  _Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> local_4d0;
  _Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> local_4c8;
  _Base_ptr local_498;
  CBlockIndex *local_490;
  _Base_ptr local_488;
  undefined1 local_480;
  undefined1 local_3c8 [392];
  undefined1 local_240 [268];
  undefined1 local_134 [100];
  undefined1 local_d0 [32];
  undefined1 local_b0 [168];
  
  uVar26 = (undefined2)((ulong)in_stack_fffffffffffff2a0 >> 0x30);
  local_b0._160_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_490 = in_RCX;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffff1a8,in_stack_fffffffffffff1a0,
             (int)((ulong)in_stack_fffffffffffff198 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x148e390);
  if (local_490 == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x967,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  CBlockHeader::GetHash((CBlockHeader *)in_stack_fffffffffffff1b8);
  bVar3 = ::operator==((base_blob<256U> *)in_stack_fffffffffffff1a8,
                       (base_blob<256U> *)in_stack_fffffffffffff1a0);
  if (!bVar3) {
    __assert_fail("*pindex->phashBlock == block_hash",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x96a,
                  "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                 );
  }
  ChainstateManager::GetCheckQueue(in_stack_fffffffffffff198);
  bVar3 = CCheckQueue<CScriptCheck>::HasThreads
                    ((CCheckQueue<CScriptCheck> *)in_stack_fffffffffffff198);
  local_498 = (_Base_ptr)std::chrono::_V2::steady_clock::now();
  ChainstateManager::GetParams(in_stack_fffffffffffff198);
  CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff198);
  bVar4 = CheckBlock(in_stack_fffffffffffff2b8,
                     (BlockValidationState *)
                     CONCAT17(in_stack_fffffffffffff2b7,in_stack_fffffffffffff2b0),
                     in_stack_fffffffffffff2a8,SUB21((ushort)uVar26 >> 8,0),SUB21(uVar26,0));
  LVar27 = (Level)in_stack_fffffffffffff340;
  iVar24 = (int)((ulong)in_stack_fffffffffffff208 >> 0x20);
  if (bVar4) {
    if (local_490->pprev == (CBlockIndex *)0x0) {
      memset(local_b0,0,0x20);
      uint256::uint256((uint256 *)in_stack_fffffffffffff198);
      local_c40 = in_stack_fffffffffffff1a8;
    }
    else {
      CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff1a8);
      local_c40 = in_stack_fffffffffffff1a8;
    }
    (**(code **)(*(long *)(in_R8->m_script_execution_cache_hasher).s + 0x10))(local_d0);
    bVar4 = ::operator==((base_blob<256U> *)local_c40,(base_blob<256U> *)in_stack_fffffffffffff1a0);
    if (!bVar4) {
      __assert_fail("hashPrevBlock == view.GetBestBlock()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0x98a,
                    "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                   );
    }
    *(long *)(*(long *)(in_RDI + 0x50) + 0x6d8) = *(long *)(*(long *)(in_RDI + 0x50) + 0x6d8) + 1;
    CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff198);
    bVar4 = ::operator==((base_blob<256U> *)local_c40,(base_blob<256U> *)in_stack_fffffffffffff1a0);
    if (bVar4) {
      if ((in_R9B & 1) == 0) {
        CBlockIndex::GetBlockHash((CBlockIndex *)local_c40);
        CCoinsViewCache::SetBestBlock
                  ((CCoinsViewCache *)in_stack_fffffffffffff198,(uint256 *)0x148e7c9);
      }
      local_8e9 = 1;
    }
    else {
      bVar4 = true;
      ChainstateManager::AssumedValidBlock(in_stack_fffffffffffff198);
      bVar5 = base_blob<256U>::IsNull((base_blob<256U> *)local_c40);
      if (!bVar5) {
        ChainstateManager::AssumedValidBlock(in_stack_fffffffffffff198);
        local_4c8._M_cur =
             (__node_type *)
             std::
             unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
             ::find((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                     *)in_stack_fffffffffffff1a0,(key_type *)in_stack_fffffffffffff198);
        std::__detail::_Node_const_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
        _Node_const_iterator
                  ((_Node_const_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                   in_stack_fffffffffffff198,
                   (_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)0x148e850);
        local_4d0._M_cur =
             (__node_type *)
             std::
             unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
             ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
                    *)in_stack_fffffffffffff1a0);
        bVar5 = std::__detail::operator==
                          ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                           local_c40,
                           (_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                           in_stack_fffffffffffff1a0);
        if (((bVar5 ^ 0xffU) & 1) != 0) {
          std::__detail::_Node_const_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
          operator->((_Node_const_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                     in_stack_fffffffffffff198);
          pCVar7 = CBlockIndex::GetAncestor
                             (in_stack_fffffffffffff1c0,
                              (int)((ulong)in_stack_fffffffffffff1b8 >> 0x20));
          if ((pCVar7 == local_490) &&
             (pCVar7 = CBlockIndex::GetAncestor
                                 ((CBlockIndex *)local_c40,
                                  (int)((ulong)in_stack_fffffffffffff1a0 >> 0x20)),
             pCVar7 == local_490)) {
            ChainstateManager::MinimumChainWork(in_stack_fffffffffffff198);
            bVar5 = operator>=((base_uint<256U> *)local_c40,
                               (base_uint<256U> *)in_stack_fffffffffffff1a0);
            if (bVar5) {
              CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff198);
              iVar13 = GetBlockProofEquivalentTime
                                 ((CBlockIndex *)in_stack_fffffffffffff1d0,in_stack_fffffffffffff1c8
                                  ,in_stack_fffffffffffff1c0,in_stack_fffffffffffff1b8);
              bVar4 = iVar13 < 0x127501;
            }
          }
        }
      }
      local_4d8 = (_Base_ptr)std::chrono::_V2::steady_clock::now();
      local_4e0 = (_Base_ptr)
                  std::chrono::operator-
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff1a0,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff198);
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)local_c40,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff1a0);
      bVar5 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff198,Trace);
      if (bVar5) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        std::chrono::operator-
                  ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff1a0,
                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff198);
        uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
        local_510._8_8_ =
             Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_518 = *(_Base_ptr *)(*(long *)(in_RDI + 0x50) + 0x6a0);
        local_510._0_8_ =
             Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_528 = *(_Base_ptr *)(*(long *)(in_RDI + 0x50) + 0x6a0);
        rVar18 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                           ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_520 = (_Base_ptr)(rVar18 / (double)*(long *)(*(long *)(in_RDI + 0x50) + 0x6d8));
        local_c40 = (CCoinsViewCache *)(local_510 + 8);
        in_stack_fffffffffffff1b0 = (ChainstateManager *)local_510;
        in_stack_fffffffffffff1b8 = (Params *)&local_520;
        in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,1);
        in_stack_fffffffffffff1a0 = "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n";
        logging_function_00._M_len._4_4_ = in_stack_fffffffffffff264;
        logging_function_00._M_len._0_4_ = in_stack_fffffffffffff260;
        logging_function_00._M_str = (char *)in_stack_fffffffffffff268;
        source_file_00._M_str = (char *)in_stack_fffffffffffff258.__r;
        source_file_00._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_00,source_file_00,
                   (int)((ulong)in_stack_fffffffffffff208 >> 0x20),in_stack_fffffffffffff200,
                   (Level)in_stack_fffffffffffff340,
                   (ConstevalFormatString<3U>)in_stack_fffffffffffff248._M_head_impl,
                   (double *)in_stack_fffffffffffff350.__r,(double *)in_stack_fffffffffffff358,
                   (double *)in_stack_fffffffffffff360);
      }
      bVar5 = IsBIP30Repeat((CBlockIndex *)in_stack_fffffffffffff198);
      if (local_490->pprev == (CBlockIndex *)0x0) {
        __assert_fail("pindex->pprev",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x9ff,
                      "bool Chainstate::ConnectBlock(const CBlock &, BlockValidationState &, CBlockIndex *, CCoinsViewCache &, bool)"
                     );
      }
      CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff198);
      pCVar7 = CBlockIndex::GetAncestor
                         ((CBlockIndex *)local_c40,(int)((ulong)in_stack_fffffffffffff1a0 >> 0x20));
      local_ae1 = 0;
      if (((bVar5 ^ 0xffU) & 1) != 0) {
        local_af1 = 1;
        if (pCVar7 != (CBlockIndex *)0x0) {
          CBlockIndex::GetBlockHash((CBlockIndex *)local_c40);
          CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff198);
          bVar5 = ::operator==((base_blob<256U> *)local_c40,
                               (base_blob<256U> *)in_stack_fffffffffffff1a0);
          local_af1 = bVar5 ^ 0xff;
        }
        local_ae1 = local_af1;
      }
      if (((local_ae1 & 1) != 0) || (0x1e44d5 < local_490->nHeight)) {
        local_530._M_nxt =
             (_Hash_node_base *)
             std::
             vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ::begin((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)in_stack_fffffffffffff1a0);
        local_538 = (_Base_ptr)
                    std::
                    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ::end((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           *)in_stack_fffffffffffff1a0);
        while (bVar5 = __gnu_cxx::
                       operator==<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                 ((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   *)local_c40,
                                  (__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                                   *)in_stack_fffffffffffff1a0), ((bVar5 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
          ::operator*((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                       *)in_stack_fffffffffffff198);
          local_980 = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)0x0;
          while( true ) {
            in_stack_fffffffffffff500 = local_980;
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffff198);
            pvVar8 = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)
                     std::vector<CTxOut,_std::allocator<CTxOut>_>::size
                               ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff198
                               );
            if (pvVar8 <= in_stack_fffffffffffff500) break;
            in_stack_fffffffffffff4f8 = in_R8;
            std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)in_stack_fffffffffffff198);
            CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff198);
            COutPoint::COutPoint
                      ((COutPoint *)local_c40,(Txid *)in_stack_fffffffffffff1a0,
                       (uint32_t)((ulong)in_stack_fffffffffffff198 >> 0x20));
            uVar9 = (**(code **)(*(long *)(in_stack_fffffffffffff4f8->
                                          m_script_execution_cache_hasher).s + 8))
                              (in_stack_fffffffffffff4f8,local_134);
            LVar27 = (Level)in_stack_fffffffffffff340;
            iVar24 = (int)((ulong)in_stack_fffffffffffff208 >> 0x20);
            if ((uVar9 & 1) != 0) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
              uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
              BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffff1b0 >> 0x20);
              pcVar23 = "ERROR: ConnectBlock(): tried to overwrite transaction\n";
              pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(uVar25,2);
              logging_function_01._M_len._4_4_ = in_stack_fffffffffffff264;
              logging_function_01._M_len._0_4_ = in_stack_fffffffffffff260;
              logging_function_01._M_str = (char *)in_stack_fffffffffffff268;
              source_file_01._M_str = (char *)in_stack_fffffffffffff258.__r;
              source_file_01._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
              LogPrintFormatInternal<>
                        (logging_function_01,source_file_01,iVar24,in_stack_fffffffffffff200,LVar27,
                         (ConstevalFormatString<0U>)in_stack_fffffffffffff248._M_head_impl);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                         (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                         (allocator<char> *)in_stack_fffffffffffff1d8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                         (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                         (allocator<char> *)in_stack_fffffffffffff1d8);
              local_8e9 = ValidationState<BlockValidationResult>::Invalid
                                    ((ValidationState<BlockValidationResult> *)
                                     in_stack_fffffffffffff1b8,BVar6,(string *)local_c40,
                                     (string *)pcVar23);
              std::__cxx11::string::~string(pbVar21);
              std::allocator<char>::~allocator(&local_55a);
              std::__cxx11::string::~string(pbVar21);
              std::allocator<char>::~allocator(local_559);
              goto LAB_014915ba;
            }
            local_980 = (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)
                        ((long)&(local_980->
                                super__Vector_base<CScriptCheck,_std::allocator<CScriptCheck>_>).
                                _M_impl.super__Vector_impl_data._M_start + 1);
          }
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
          ::operator++((__normal_iterator<const_std::shared_ptr<const_CTransaction>_*,_std::vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>_>
                        *)in_stack_fffffffffffff198);
        }
      }
      DeploymentActiveAt<Consensus::BuriedDeployment>
                ((CBlockIndex *)local_c40,(ChainstateManager *)in_stack_fffffffffffff1a0,
                 (BuriedDeployment)((ulong)in_stack_fffffffffffff198 >> 0x30));
      GetBlockScriptFlags((CBlockIndex *)in_stack_fffffffffffff1b8,in_stack_fffffffffffff1b0);
      local_568 = (_Base_ptr)std::chrono::_V2::steady_clock::now();
      local_5a0._48_8_ =
           std::chrono::operator-
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffff1a0,
                      (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffff198);
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)local_c40,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff1a0);
      bVar5 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff198,Trace);
      if (bVar5) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        std::chrono::operator-
                  ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff1a0,
                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffff198);
        uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
        local_5a0._8_8_ =
             Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_5a8 = *(_Base_ptr *)(*(long *)(in_RDI + 0x50) + 0x6a8);
        local_5a0._0_8_ =
             Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_5b8 = *(_Base_ptr *)(*(long *)(in_RDI + 0x50) + 0x6a8);
        rVar18 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                           ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_5b0 = (_Base_ptr)(rVar18 / (double)*(long *)(*(long *)(in_RDI + 0x50) + 0x6d8));
        local_c40 = (CCoinsViewCache *)(local_5a0 + 8);
        in_stack_fffffffffffff1b0 = (ChainstateManager *)local_5a0;
        in_stack_fffffffffffff1b8 = (Params *)&local_5b0;
        in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,1);
        in_stack_fffffffffffff1a0 = "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n";
        logging_function_02._M_len._4_4_ = in_stack_fffffffffffff264;
        logging_function_02._M_len._0_4_ = in_stack_fffffffffffff260;
        logging_function_02._M_str = (char *)in_stack_fffffffffffff268;
        source_file_02._M_str = (char *)in_stack_fffffffffffff258.__r;
        source_file_02._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
        LogPrintFormatInternal<double,double,double>
                  (logging_function_02,source_file_02,
                   (int)((ulong)in_stack_fffffffffffff208 >> 0x20),in_stack_fffffffffffff200,
                   (Level)in_stack_fffffffffffff340,
                   (ConstevalFormatString<3U>)in_stack_fffffffffffff248._M_head_impl,
                   (double *)in_stack_fffffffffffff350.__r,(double *)in_stack_fffffffffffff358,
                   (double *)in_stack_fffffffffffff360);
      }
      CBlockUndo::CBlockUndo((CBlockUndo *)in_stack_fffffffffffff198);
      if ((bVar4) && (bVar3)) {
        ChainstateManager::GetCheckQueue(in_stack_fffffffffffff198);
      }
      CCheckQueueControl<CScriptCheck>::CCheckQueueControl
                ((CCheckQueueControl<CScriptCheck> *)local_c40,
                 (CCheckQueue<FakeCheckCheckCompletion> *)in_stack_fffffffffffff1a0);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffff198);
      std::allocator<PrecomputedTransactionData>::allocator
                ((allocator<PrecomputedTransactionData> *)in_stack_fffffffffffff198);
      std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::vector
                ((vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_> *)
                 in_stack_fffffffffffff1c8,(size_type)in_stack_fffffffffffff1c0,
                 (allocator_type *)in_stack_fffffffffffff1b8);
      std::allocator<PrecomputedTransactionData>::~allocator
                ((allocator<PrecomputedTransactionData> *)in_stack_fffffffffffff198);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff198);
      local_610 = (_Base_ptr)0x0;
      local_9a4 = 0;
      local_9b0 = 0;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffff198);
      std::vector<CTxUndo,_std::allocator<CTxUndo>_>::reserve
                ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffff1d8,
                 (size_type)in_stack_fffffffffffff1d0);
      local_9b4 = 0;
      while( true ) {
        sVar10 = std::
                 vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)in_stack_fffffffffffff198);
        LVar27 = (Level)in_stack_fffffffffffff340;
        iVar24 = (int)((ulong)in_stack_fffffffffffff208 >> 0x20);
        if (sVar10 <= local_9b4) break;
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_c40,(size_type)in_stack_fffffffffffff1a0);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)local_c40);
        sVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                           ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff198);
        local_9a4 = local_9a4 + (int)sVar10;
        bVar5 = CTransaction::IsCoinBase((CTransaction *)local_c40);
        if (!bVar5) {
          local_618 = (_Base_ptr)0x0;
          TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffff198);
          bVar5 = Consensus::CheckTxInputs
                            (in_stack_fffffffffffff278,
                             (TxValidationState *)
                             CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                             in_stack_fffffffffffff268,in_stack_fffffffffffff264,
                             (CAmount *)in_stack_fffffffffffff258.__r);
          if (bVar5) {
            local_610 = (_Base_ptr)((long)&local_618->_M_color + (long)&local_610->_M_color);
            bVar5 = MoneyRange((CAmount *)in_stack_fffffffffffff198);
            if (bVar5) {
              std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                        ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffff198);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1b8,
                         (size_type)in_stack_fffffffffffff1b0);
              for (local_9e0 = 0;
                  sVar10 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                      in_stack_fffffffffffff198), local_9e0 < sVar10;
                  local_9e0 = local_9e0 + 1) {
                std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                          ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_c40,
                           (size_type)in_stack_fffffffffffff1a0);
                pCVar11 = CCoinsViewCache::AccessCoin
                                    (local_c40,(COutPoint *)in_stack_fffffffffffff1a0);
                uVar1 = *(uint *)&pCVar11->field_0x28;
                puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                            ((vector<int,_std::allocator<int>_> *)local_c40,
                                             (size_type)in_stack_fffffffffffff1a0);
                *puVar12 = uVar1 >> 1;
              }
              bVar5 = SequenceLocks((CTransaction *)in_stack_fffffffffffff1c8,
                                    (int)((ulong)in_stack_fffffffffffff1c0 >> 0x20),
                                    (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1b8,
                                    (CBlockIndex *)in_stack_fffffffffffff1b0);
              if (bVar5) {
                bVar5 = false;
              }
              else {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
                uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
                local_c40 = (CCoinsViewCache *)0x1d35774;
                in_stack_fffffffffffff1a0 = "ERROR: %s: contains a non-BIP68-final transaction\n";
                in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,2);
                logging_function_05._M_len._4_4_ = in_stack_fffffffffffff264;
                logging_function_05._M_len._0_4_ = in_stack_fffffffffffff260;
                logging_function_05._M_str = (char *)in_stack_fffffffffffff268;
                source_file_05._M_str = (char *)in_stack_fffffffffffff258.__r;
                source_file_05._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
                LogPrintFormatInternal<char[13]>
                          (logging_function_05,source_file_05,
                           (int)((ulong)in_stack_fffffffffffff208 >> 0x20),in_stack_fffffffffffff200
                           ,(Level)in_stack_fffffffffffff340,
                           (ConstevalFormatString<1U>)in_stack_fffffffffffff248._M_head_impl,
                           (char (*) [13])in_stack_fffffffffffff350.__r);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                           (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                           (allocator<char> *)in_stack_fffffffffffff1d8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                           (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                           (allocator<char> *)in_stack_fffffffffffff1d8);
                local_8e9 = ValidationState<BlockValidationResult>::Invalid
                                      ((ValidationState<BlockValidationResult> *)
                                       in_stack_fffffffffffff1b8,
                                       (BlockValidationResult)
                                       ((ulong)in_stack_fffffffffffff1b0 >> 0x20),
                                       (string *)local_c40,(string *)in_stack_fffffffffffff1a0);
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff198);
                std::allocator<char>::~allocator((allocator<char> *)(local_6c8 + 0x46));
                std::__cxx11::string::~string
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffff198);
                std::allocator<char>::~allocator(local_681);
                bVar5 = true;
              }
            }
            else {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
              uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
              local_c40 = (CCoinsViewCache *)0x1d35774;
              in_stack_fffffffffffff1a0 = "ERROR: %s: accumulated fee in the block out of range.\n";
              in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,2);
              logging_function_04._M_len._4_4_ = in_stack_fffffffffffff264;
              logging_function_04._M_len._0_4_ = in_stack_fffffffffffff260;
              logging_function_04._M_str = (char *)in_stack_fffffffffffff268;
              source_file_04._M_str = (char *)in_stack_fffffffffffff258.__r;
              source_file_04._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
              LogPrintFormatInternal<char[13]>
                        (logging_function_04,source_file_04,
                         (int)((ulong)in_stack_fffffffffffff208 >> 0x20),in_stack_fffffffffffff200,
                         (Level)in_stack_fffffffffffff340,
                         (ConstevalFormatString<1U>)in_stack_fffffffffffff248._M_head_impl,
                         (char (*) [13])in_stack_fffffffffffff350.__r);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                         (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                         (allocator<char> *)in_stack_fffffffffffff1d8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                         (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                         (allocator<char> *)in_stack_fffffffffffff1d8);
              local_8e9 = ValidationState<BlockValidationResult>::Invalid
                                    ((ValidationState<BlockValidationResult> *)
                                     in_stack_fffffffffffff1b8,
                                     (BlockValidationResult)
                                     ((ulong)in_stack_fffffffffffff1b0 >> 0x20),(string *)local_c40,
                                     (string *)in_stack_fffffffffffff1a0);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff198);
              std::allocator<char>::~allocator(&local_65a);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff198);
              std::allocator<char>::~allocator(local_659);
              bVar5 = true;
            }
          }
          else {
            ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                      ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff1a0);
            ValidationState<TxValidationResult>::GetDebugMessage_abi_cxx11_
                      ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff1a0);
            ValidationState<BlockValidationResult>::Invalid
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1b8,
                       (BlockValidationResult)((ulong)in_stack_fffffffffffff1b0 >> 0x20),
                       (string *)local_c40,(string *)in_stack_fffffffffffff1a0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8
                       ,(char *)in_stack_fffffffffffff1b0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8
                       ,(char *)in_stack_fffffffffffff1b0);
            CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff198);
            uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
            transaction_identifier<false>::ToString_abi_cxx11_
                      ((transaction_identifier<false> *)in_stack_fffffffffffff1a0);
            ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1d8);
            in_stack_fffffffffffff1b8 = (Params *)local_240;
            in_stack_fffffffffffff1b0 = (ChainstateManager *)(local_240 + 0x20);
            local_c40 = (CCoinsViewCache *)0x1d35774;
            in_stack_fffffffffffff1a0 = "%s: Consensus::CheckTxInputs: %s, %s\n";
            in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,4);
            logging_function_03._M_len._4_4_ = in_stack_fffffffffffff264;
            logging_function_03._M_len._0_4_ = in_stack_fffffffffffff260;
            logging_function_03._M_str = (char *)in_stack_fffffffffffff268;
            source_file_03._M_str = (char *)in_stack_fffffffffffff258.__r;
            source_file_03._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
            LogPrintFormatInternal<char[13],std::__cxx11::string,std::__cxx11::string>
                      (logging_function_03,source_file_03,
                       (int)((ulong)in_stack_fffffffffffff208 >> 0x20),in_stack_fffffffffffff200,
                       (Level)in_stack_fffffffffffff340,
                       (ConstevalFormatString<3U>)in_stack_fffffffffffff248._M_head_impl,
                       (char (*) [13])in_stack_fffffffffffff350.__r,in_stack_fffffffffffff358,
                       in_stack_fffffffffffff360);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            local_8e9 = 0;
            bVar5 = true;
          }
          TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffff198);
          if (bVar5) goto LAB_0149154e;
        }
        iVar13 = GetTransactionSigOpCost
                           (in_stack_fffffffffffff1f0,
                            (CCoinsViewCache *)
                            CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                            in_stack_fffffffffffff1e4);
        LVar27 = (Level)in_stack_fffffffffffff340;
        iVar24 = (int)((ulong)in_stack_fffffffffffff208 >> 0x20);
        local_9b0 = iVar13 + local_9b0;
        if (80000 < local_9b0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                     (char *)in_stack_fffffffffffff1b0);
          uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                     (char *)in_stack_fffffffffffff1b0);
          BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffff1b0 >> 0x20);
          pcVar23 = "ERROR: ConnectBlock(): too many sigops\n";
          in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,2);
          logging_function_06._M_len._4_4_ = in_stack_fffffffffffff264;
          logging_function_06._M_len._0_4_ = in_stack_fffffffffffff260;
          logging_function_06._M_str = (char *)in_stack_fffffffffffff268;
          source_file_06._M_str = (char *)in_stack_fffffffffffff258.__r;
          source_file_06._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
          LogPrintFormatInternal<>
                    (logging_function_06,source_file_06,iVar24,in_stack_fffffffffffff200,LVar27,
                     (ConstevalFormatString<0U>)in_stack_fffffffffffff248._M_head_impl);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                     (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                     (allocator<char> *)in_stack_fffffffffffff1d8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                     (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                     (allocator<char> *)in_stack_fffffffffffff1d8);
          local_8e9 = ValidationState<BlockValidationResult>::Invalid
                                ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1b8
                                 ,BVar6,(string *)local_c40,(string *)pcVar23);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff198);
          std::allocator<char>::~allocator((allocator<char> *)(local_6c8 + 0x1e));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff198);
          std::allocator<char>::~allocator((allocator<char> *)(local_6c8 + 0x1f));
          goto LAB_0149154e;
        }
        bVar5 = CTransaction::IsCoinBase((CTransaction *)local_c40);
        if (!bVar5) {
          std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::vector
                    ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     in_stack_fffffffffffff198);
          TxValidationState::TxValidationState((TxValidationState *)in_stack_fffffffffffff198);
          if (bVar4) {
            in_stack_fffffffffffff198 =
                 (ChainstateManager *)
                 std::
                 vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::
                 operator[]((vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>
                             *)local_c40,(size_type)in_stack_fffffffffffff1a0);
            in_stack_fffffffffffff1a0 = (char *)(*(long *)(in_RDI + 0x50) + 0xa58);
            if (bVar3) {
              local_c40 = (CCoinsViewCache *)local_6c8;
            }
            else {
              local_c40 = (CCoinsViewCache *)0x0;
            }
            bVar5 = CheckInputScripts(in_stack_fffffffffffff298,in_stack_fffffffffffff290,
                                      in_stack_fffffffffffff288,
                                      (uint)((ulong)in_stack_fffffffffffff2d0 >> 0x20),
                                      SUB81((ulong)in_stack_fffffffffffff280 >> 0x38,0),
                                      SUB81((ulong)in_stack_fffffffffffff280 >> 0x30,0),
                                      in_stack_fffffffffffff4f0,in_stack_fffffffffffff4f8,
                                      in_stack_fffffffffffff500);
            if (bVar5) goto LAB_014902af;
            ValidationState<TxValidationResult>::GetRejectReason_abi_cxx11_
                      ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff1a0);
            ValidationState<TxValidationResult>::GetDebugMessage_abi_cxx11_
                      ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff1a0);
            ValidationState<BlockValidationResult>::Invalid
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1b8,
                       (BlockValidationResult)((ulong)in_stack_fffffffffffff1b0 >> 0x20),
                       (string *)local_c40,(string *)in_stack_fffffffffffff1a0);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8
                       ,(char *)in_stack_fffffffffffff1b0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8
                       ,(char *)in_stack_fffffffffffff1b0);
            CTransaction::GetHash((CTransaction *)in_stack_fffffffffffff198);
            uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
            transaction_identifier<false>::ToString_abi_cxx11_
                      ((transaction_identifier<false> *)in_stack_fffffffffffff1a0);
            ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1d8);
            in_stack_fffffffffffff1b0 = (ChainstateManager *)local_3c8;
            local_c40 = (CCoinsViewCache *)(local_3c8 + 0x20);
            in_stack_fffffffffffff1a0 = "ConnectBlock(): CheckInputScripts on %s failed with %s\n";
            in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,4);
            logging_function_07._M_len._4_4_ = in_stack_fffffffffffff264;
            logging_function_07._M_len._0_4_ = in_stack_fffffffffffff260;
            logging_function_07._M_str = (char *)in_stack_fffffffffffff268;
            source_file_07._M_str = (char *)in_stack_fffffffffffff258.__r;
            source_file_07._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_07,source_file_07,
                       (int)((ulong)in_stack_fffffffffffff208 >> 0x20),in_stack_fffffffffffff200,
                       (Level)in_stack_fffffffffffff340,
                       (ConstevalFormatString<2U>)in_stack_fffffffffffff248._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff350.__r,in_stack_fffffffffffff358);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff198);
            local_8e9 = 0;
            bVar5 = true;
          }
          else {
LAB_014902af:
            CCheckQueueControl<CScriptCheck>::Add
                      ((CCheckQueueControl<CScriptCheck> *)local_c40,
                       (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                        *)in_stack_fffffffffffff1a0);
            bVar5 = false;
          }
          TxValidationState::~TxValidationState((TxValidationState *)in_stack_fffffffffffff198);
          std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
                    ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                     local_c40);
          if (bVar5) goto LAB_0149154e;
        }
        CTxUndo::CTxUndo((CTxUndo *)in_stack_fffffffffffff198);
        if (local_9b4 != 0) {
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::emplace_back<>
                    ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)local_c40);
          std::vector<CTxUndo,_std::allocator<CTxUndo>_>::back
                    ((vector<CTxUndo,_std::allocator<CTxUndo>_> *)in_stack_fffffffffffff198);
        }
        UpdateCoins(in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0,
                    (CTxUndo *)in_stack_fffffffffffff1c8,
                    (int)((ulong)in_stack_fffffffffffff1c0 >> 0x20));
        CTxUndo::~CTxUndo((CTxUndo *)in_stack_fffffffffffff198);
        local_9b4 = local_9b4 + 1;
      }
      local_708 = (_Base_ptr)std::chrono::_V2::steady_clock::now();
      local_710 = (_Base_ptr)
                  std::chrono::operator-
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff1a0,
                             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffff198);
      std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                ((duration<long,_std::ratio<1L,_1000000000L>_> *)local_c40,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff1a0);
      bVar3 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff198,Trace);
      if (bVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        sVar10 = std::
                 vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)in_stack_fffffffffffff198);
        local_740._12_4_ = (undefined4)sVar10;
        tVar15 = std::chrono::operator-
                           ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)in_stack_fffffffffffff1a0,
                            (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             *)in_stack_fffffffffffff198);
        in_stack_fffffffffffff370._M_head_impl =
             (Chainstate *)
             Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_740._0_8_ = in_stack_fffffffffffff370._M_head_impl;
        in_stack_fffffffffffff368 =
             std::chrono::operator-
                       ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffff1a0,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffff198);
        in_stack_fffffffffffff360 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                       ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        sVar10 = std::
                 vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         *)in_stack_fffffffffffff198);
        auVar19._8_4_ = (int)(sVar10 >> 0x20);
        auVar19._0_8_ = sVar10;
        auVar19._12_4_ = 0x45300000;
        local_748.m_resource =
             (PoolResource<144UL,_8UL> *)
             ((double)in_stack_fffffffffffff360 /
             ((auVar19._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)));
        if (local_9a4 < 2) {
          in_stack_fffffffffffff358 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
        else {
          in_stack_fffffffffffff350 =
               std::chrono::operator-
                         ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff1a0,
                          (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                           *)in_stack_fffffffffffff198);
          rVar18 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                             ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
          in_stack_fffffffffffff358 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (rVar18 / (double)(local_9a4 + -1));
        }
        uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
        local_760 = *(_Base_ptr *)(*(long *)(in_RDI + 0x50) + 0x6b0);
        local_750 = in_stack_fffffffffffff358;
        p_Var17 = (_List_node_base *)
                  Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_7a0._48_8_ = *(int64_t *)(*(long *)(in_RDI + 0x50) + 0x6b0);
        local_758 = p_Var17;
        rVar18 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                           ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
        local_7a0._56_8_ = rVar18 / (double)*(long *)(*(long *)(in_RDI + 0x50) + 0x6d8);
        in_stack_fffffffffffff1d0 = (CCoinsViewCache *)(local_7a0 + 0x38);
        in_stack_fffffffffffff1b8 = (Params *)&local_748;
        in_stack_fffffffffffff1b0 = (ChainstateManager *)local_740;
        local_c40 = (CCoinsViewCache *)(local_740 + 0xc);
        in_stack_fffffffffffff1a0 =
             "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n"
        ;
        in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,1);
        logging_function_08._M_len._4_4_ = in_stack_fffffffffffff264;
        logging_function_08._M_len._0_4_ = in_stack_fffffffffffff260;
        logging_function_08._M_str = (char *)in_stack_fffffffffffff268;
        source_file_08._M_str = (char *)in_stack_fffffffffffff258.__r;
        source_file_08._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
        LVar27 = (Level)p_Var17;
        LogPrintFormatInternal<unsigned_int,double,double,double,double,double>
                  (logging_function_08,source_file_08,iVar24,in_stack_fffffffffffff200,LVar27,
                   (ConstevalFormatString<6U>)in_stack_fffffffffffff248._M_head_impl,
                   (uint *)in_stack_fffffffffffff350.__r,(double *)in_stack_fffffffffffff358,
                   (double *)in_stack_fffffffffffff360,(double *)in_stack_fffffffffffff368.__r,
                   (double *)in_stack_fffffffffffff370._M_head_impl,(double *)tVar15.__r);
      }
      p_Var2 = local_610;
      CChainParams::GetConsensus((CChainParams *)in_stack_fffffffffffff198);
      CVar14 = GetBlockSubsidy((int)((ulong)in_stack_fffffffffffff1b0 >> 0x20),(Params *)local_c40);
      local_7a0._40_8_ = (long)&p_Var2->_M_color + CVar14;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    *)local_c40,(size_type)in_stack_fffffffffffff1a0);
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)in_stack_fffffffffffff198);
      CVar14 = CTransaction::GetValueOut((CTransaction *)in_stack_fffffffffffff1d0);
      if ((long)local_7a0._40_8_ < CVar14) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                   (char *)in_stack_fffffffffffff1b0);
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_c40,(size_type)in_stack_fffffffffffff1a0);
        std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)in_stack_fffffffffffff198);
        uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
        local_7a0._0_8_ = CTransaction::GetValueOut((CTransaction *)in_stack_fffffffffffff1d0);
        BVar6 = (BlockValidationResult)((ulong)(local_7a0 + 0x28) >> 0x20);
        local_c40 = (CCoinsViewCache *)local_7a0;
        pcVar23 = "ERROR: ConnectBlock(): coinbase pays too much (actual=%d vs limit=%d)\n";
        in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,2);
        logging_function_09._M_len._4_4_ = in_stack_fffffffffffff264;
        logging_function_09._M_len._0_4_ = in_stack_fffffffffffff260;
        logging_function_09._M_str = (char *)in_stack_fffffffffffff268;
        source_file_09._M_str = (char *)in_stack_fffffffffffff258.__r;
        source_file_09._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
        LogPrintFormatInternal<long,long>
                  (logging_function_09,source_file_09,iVar24,in_stack_fffffffffffff200,LVar27,
                   (ConstevalFormatString<2U>)in_stack_fffffffffffff248._M_head_impl,
                   (long *)in_stack_fffffffffffff350.__r,(long *)in_stack_fffffffffffff358);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                   (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                   (allocator<char> *)in_stack_fffffffffffff1d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                   (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                   (allocator<char> *)in_stack_fffffffffffff1d8);
        local_8e9 = ValidationState<BlockValidationResult>::Invalid
                              ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1b8,
                               BVar6,(string *)local_c40,(string *)pcVar23);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff198);
        std::allocator<char>::~allocator(&local_7a2);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff198);
        std::allocator<char>::~allocator(&local_7a1);
      }
      else {
        bVar3 = CCheckQueueControl<CScriptCheck>::Wait
                          ((CCheckQueueControl<CScriptCheck> *)in_stack_fffffffffffff1b0);
        if (bVar3) {
          local_7d8 = (_Base_ptr)std::chrono::_V2::steady_clock::now();
          local_7e0 = (_Base_ptr)
                      std::chrono::operator-
                                ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)in_stack_fffffffffffff1a0,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)in_stack_fffffffffffff198);
          std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)local_c40,
                     (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff1a0);
          bVar3 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff198,Trace);
          if (bVar3) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8
                       ,(char *)in_stack_fffffffffffff1b0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8
                       ,(char *)in_stack_fffffffffffff1b0);
            local_810._12_4_ = local_9a4 + -1;
            std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff1a0,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffff198);
            local_810._0_8_ =
                 Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                           ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
            if (local_9a4 < 2) {
              local_818 = (ListNode *)0x0;
            }
            else {
              std::chrono::operator-
                        ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff1a0,
                         (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                          *)in_stack_fffffffffffff198);
              rVar18 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                 ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
              local_818 = (ListNode *)(rVar18 / (double)(local_9a4 + -1));
            }
            uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
            local_828 = *(_Base_ptr *)(*(long *)(in_RDI + 0x50) + 0x6b8);
            local_820 = (ListNode *)
                        Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
            local_838 = *(_Base_ptr *)(*(long *)(in_RDI + 0x50) + 0x6b8);
            rVar18 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
            local_830 = (_Base_ptr)(rVar18 / (double)*(long *)(*(long *)(in_RDI + 0x50) + 0x6d8));
            in_stack_fffffffffffff1b8 = (Params *)&local_818;
            in_stack_fffffffffffff1b0 = (ChainstateManager *)local_810;
            local_c40 = (CCoinsViewCache *)(local_810 + 0xc);
            in_stack_fffffffffffff1a0 =
                 "    - Verify %u txins: %.2fms (%.3fms/txin) [%.2fs (%.2fms/blk)]\n";
            in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,1);
            logging_function_11._M_len._4_4_ = in_stack_fffffffffffff264;
            logging_function_11._M_len._0_4_ = in_stack_fffffffffffff260;
            logging_function_11._M_str = (char *)in_stack_fffffffffffff268;
            source_file_11._M_str = (char *)in_stack_fffffffffffff258.__r;
            source_file_11._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
            LogPrintFormatInternal<int,double,double,double,double>
                      (logging_function_11,source_file_11,iVar24,in_stack_fffffffffffff200,LVar27,
                       (ConstevalFormatString<5U>)in_stack_fffffffffffff248._M_head_impl,
                       (int *)in_stack_fffffffffffff350.__r,(double *)in_stack_fffffffffffff358,
                       (double *)in_stack_fffffffffffff360,(double *)in_stack_fffffffffffff368.__r,
                       (double *)in_stack_fffffffffffff370._M_head_impl);
          }
          if ((in_R9B & 1) == 0) {
            bVar3 = ::node::BlockManager::WriteUndoDataForBlock
                              (in_stack_fffffffffffff240,
                               (CBlockUndo *)
                               CONCAT17(in_stack_fffffffffffff23f,in_stack_fffffffffffff238),
                               in_stack_fffffffffffff230,
                               (CBlockIndex *)
                               CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228));
            if (bVar3) {
              local_840 = (ListNode *)std::chrono::_V2::steady_clock::now();
              tVar15 = std::chrono::operator-
                                 ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)in_stack_fffffffffffff1a0,
                                  (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                   *)in_stack_fffffffffffff198);
              local_848 = (ListNode *)tVar15;
              std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)local_c40,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff1a0);
              bVar3 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff198,Trace);
              uVar25 = CONCAT13(bVar3,(int3)in_stack_fffffffffffff264);
              if (bVar3) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
                in_stack_fffffffffffff258 =
                     std::chrono::operator-
                               ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffff1a0,
                                (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffff198);
                uVar22 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
                in_stack_fffffffffffff250._M_head_impl =
                     (Chainstate *)
                     Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
                local_880 = *(_List_node_base **)(*(long *)(in_RDI + 0x50) + 0x6c0);
                local_878._8_8_ = in_stack_fffffffffffff250._M_head_impl;
                in_stack_fffffffffffff248._M_head_impl =
                     (Chainstate *)
                     Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                               ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
                local_8c8._56_8_ = *(size_t *)(*(long *)(in_RDI + 0x50) + 0x6c0);
                local_878._0_8_ = in_stack_fffffffffffff248._M_head_impl;
                rVar18 = Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                   ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
                local_8c8._64_8_ = rVar18 / (double)*(long *)(*(long *)(in_RDI + 0x50) + 0x6d8);
                in_stack_fffffffffffff1b8 = (Params *)(local_8c8 + 0x40);
                in_stack_fffffffffffff1b0 = (ChainstateManager *)local_878;
                local_c40 = (CCoinsViewCache *)(local_878 + 8);
                in_stack_fffffffffffff1a0 = "    - Write undo data: %.2fms [%.2fs (%.2fms/blk)]\n";
                in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar22,1);
                logging_function_12._M_len._4_4_ = uVar25;
                logging_function_12._M_len._0_4_ = in_stack_fffffffffffff260;
                logging_function_12._M_str = (char *)tVar15.__r;
                source_file_12._M_str = (char *)in_stack_fffffffffffff258.__r;
                source_file_12._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
                LogPrintFormatInternal<double,double,double>
                          (logging_function_12,source_file_12,iVar24,in_stack_fffffffffffff200,
                           LVar27,(ConstevalFormatString<3U>)in_stack_fffffffffffff248._M_head_impl,
                           (double *)in_stack_fffffffffffff350.__r,
                           (double *)in_stack_fffffffffffff358,(double *)in_stack_fffffffffffff360);
              }
              bVar3 = CBlockIndex::IsValid
                                ((CBlockIndex *)in_stack_fffffffffffff1b0,
                                 (BlockStatus)((ulong)local_c40 >> 0x20));
              if (!bVar3) {
                CBlockIndex::RaiseValidity
                          ((CBlockIndex *)in_stack_fffffffffffff1b0,
                           (BlockStatus)((ulong)local_c40 >> 0x20));
                pVar20 = std::
                         set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                         ::insert((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>
                                   *)local_c40,(value_type *)in_stack_fffffffffffff1a0);
                local_488 = (_Base_ptr)pVar20.first._M_node;
                local_480 = pVar20.second;
              }
              CBlockIndex::GetBlockHash((CBlockIndex *)local_c40);
              CCoinsViewCache::SetBestBlock
                        ((CCoinsViewCache *)in_stack_fffffffffffff198,(uint256 *)0x149132a);
              local_8c8._48_8_ = std::chrono::_V2::steady_clock::now();
              local_8c8._40_8_ =
                   std::chrono::operator-
                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff1a0,
                              (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffff198);
              std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator+=
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)local_c40,
                         (duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffff1a0);
              bVar3 = ::LogAcceptCategory((LogFlags)in_stack_fffffffffffff198,Trace);
              if (bVar3) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff1b8,(char *)in_stack_fffffffffffff1b0);
                tVar16 = std::chrono::operator-
                                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)in_stack_fffffffffffff1a0,
                                    (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)in_stack_fffffffffffff198);
                iVar24 = (int)((ulong)tVar16.__r >> 0x20);
                uVar22 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
                flag = (_func_int **)
                       Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                 ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
                local_8c8._0_8_ = flag;
                Ticks<std::chrono::duration<double,std::ratio<1l,1l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
                Ticks<std::chrono::duration<double,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_>)local_c40);
                local_c40 = (CCoinsViewCache *)local_8c8;
                in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar22,1);
                logging_function_13._M_len._4_4_ = uVar25;
                logging_function_13._M_len._0_4_ = in_stack_fffffffffffff260;
                logging_function_13._M_str = (char *)tVar15.__r;
                source_file_13._M_str = (char *)in_stack_fffffffffffff258.__r;
                source_file_13._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
                LogPrintFormatInternal<double,double,double>
                          (logging_function_13,source_file_13,iVar24,(LogFlags)flag,LVar27,
                           (ConstevalFormatString<3U>)in_stack_fffffffffffff248._M_head_impl,
                           (double *)in_stack_fffffffffffff350.__r,
                           (double *)in_stack_fffffffffffff358,(double *)in_stack_fffffffffffff360);
              }
              local_8e9 = 1;
            }
            else {
              local_8e9 = 0;
            }
          }
          else {
            local_8e9 = 1;
          }
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                     (char *)in_stack_fffffffffffff1b0);
          uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                     (char *)in_stack_fffffffffffff1b0);
          BVar6 = (BlockValidationResult)((ulong)in_stack_fffffffffffff1b0 >> 0x20);
          local_c40 = (CCoinsViewCache *)0x1d35774;
          pcVar23 = "ERROR: %s: CheckQueue failed\n";
          in_stack_fffffffffffff198 = (ChainstateManager *)CONCAT44(uVar25,2);
          logging_function_10._M_len._4_4_ = in_stack_fffffffffffff264;
          logging_function_10._M_len._0_4_ = in_stack_fffffffffffff260;
          logging_function_10._M_str = (char *)in_stack_fffffffffffff268;
          source_file_10._M_str = (char *)in_stack_fffffffffffff258.__r;
          source_file_10._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
          LogPrintFormatInternal<char[13]>
                    (logging_function_10,source_file_10,iVar24,in_stack_fffffffffffff200,LVar27,
                     (ConstevalFormatString<1U>)in_stack_fffffffffffff248._M_head_impl,
                     (char (*) [13])in_stack_fffffffffffff350.__r);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                     (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                     (allocator<char> *)in_stack_fffffffffffff1d8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff1ef,in_stack_fffffffffffff1e8),
                     (char *)CONCAT44(in_stack_fffffffffffff1e4,in_stack_fffffffffffff1e0),
                     (allocator<char> *)in_stack_fffffffffffff1d8);
          local_8e9 = ValidationState<BlockValidationResult>::Invalid
                                ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1b8
                                 ,BVar6,(string *)local_c40,(string *)pcVar23);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff198);
          std::allocator<char>::~allocator(&local_7ca);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff198);
          std::allocator<char>::~allocator(local_7c9);
        }
      }
LAB_0149154e:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_c40);
      std::vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_>::~vector
                ((vector<PrecomputedTransactionData,_std::allocator<PrecomputedTransactionData>_> *)
                 local_c40);
      CCheckQueueControl<CScriptCheck>::~CCheckQueueControl
                ((CCheckQueueControl<CScriptCheck> *)local_c40);
      CBlockUndo::~CBlockUndo((CBlockUndo *)in_stack_fffffffffffff198);
    }
  }
  else {
    BVar6 = ValidationState<BlockValidationResult>::GetResult
                      ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff198);
    if (BVar6 == BLOCK_MUTATED) {
      ChainstateManager::GetNotifications(in_stack_fffffffffffff198);
      str.lit._7_1_ = in_stack_fffffffffffff1ef;
      str.lit._0_7_ = in_stack_fffffffffffff1e8;
      ::_(str);
      local_8e9 = FatalError((Notifications *)in_stack_fffffffffffff1a8,
                             (BlockValidationState *)in_stack_fffffffffffff1a0,
                             (bilingual_str *)in_stack_fffffffffffff198);
      bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffff198);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                 (char *)in_stack_fffffffffffff1b0);
      uVar25 = (undefined4)((ulong)in_stack_fffffffffffff198 >> 0x20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff1b8,
                 (char *)in_stack_fffffffffffff1b0);
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((ValidationState<BlockValidationResult> *)in_stack_fffffffffffff1d8);
      pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(uVar25,4);
      logging_function._M_len._4_4_ = in_stack_fffffffffffff264;
      logging_function._M_len._0_4_ = in_stack_fffffffffffff260;
      logging_function._M_str = (char *)in_stack_fffffffffffff268;
      source_file._M_str = (char *)in_stack_fffffffffffff258.__r;
      source_file._M_len = (size_t)in_stack_fffffffffffff250._M_head_impl;
      LogPrintFormatInternal<char[13],std::__cxx11::string>
                (logging_function,source_file,iVar24,in_stack_fffffffffffff200,LVar27,
                 (ConstevalFormatString<2U>)in_stack_fffffffffffff248._M_head_impl,
                 (char (*) [13])in_stack_fffffffffffff350.__r,in_stack_fffffffffffff358);
      std::__cxx11::string::~string(pbVar21);
      local_8e9 = 0;
    }
  }
LAB_014915ba:
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != (_Base_ptr)local_b0._160_8_) {
    __stack_chk_fail();
  }
  return (bool)(local_8e9 & 1);
}

Assistant:

bool Chainstate::ConnectBlock(const CBlock& block, BlockValidationState& state, CBlockIndex* pindex,
                               CCoinsViewCache& view, bool fJustCheck)
{
    AssertLockHeld(cs_main);
    assert(pindex);

    uint256 block_hash{block.GetHash()};
    assert(*pindex->phashBlock == block_hash);
    const bool parallel_script_checks{m_chainman.GetCheckQueue().HasThreads()};

    const auto time_start{SteadyClock::now()};
    const CChainParams& params{m_chainman.GetParams()};

    // Check it again in case a previous version let a bad block in
    // NOTE: We don't currently (re-)invoke ContextualCheckBlock() or
    // ContextualCheckBlockHeader() here. This means that if we add a new
    // consensus rule that is enforced in one of those two functions, then we
    // may have let in a block that violates the rule prior to updating the
    // software, and we would NOT be enforcing the rule here. Fully solving
    // upgrade from one software version to the next after a consensus rule
    // change is potentially tricky and issue-specific (see NeedsRedownload()
    // for one approach that was used for BIP 141 deployment).
    // Also, currently the rule against blocks more than 2 hours in the future
    // is enforced in ContextualCheckBlockHeader(); we wouldn't want to
    // re-enforce that rule here (at least until we make it impossible for
    // the clock to go backward).
    if (!CheckBlock(block, state, params.GetConsensus(), !fJustCheck, !fJustCheck)) {
        if (state.GetResult() == BlockValidationResult::BLOCK_MUTATED) {
            // We don't write down blocks to disk if they may have been
            // corrupted, so this should be impossible unless we're having hardware
            // problems.
            return FatalError(m_chainman.GetNotifications(), state, _("Corrupt block found indicating potential hardware failure."));
        }
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }

    // verify that the view's current state corresponds to the previous block
    uint256 hashPrevBlock = pindex->pprev == nullptr ? uint256() : pindex->pprev->GetBlockHash();
    assert(hashPrevBlock == view.GetBestBlock());

    m_chainman.num_blocks_total++;

    // Special case for the genesis block, skipping connection of its transactions
    // (its coinbase is unspendable)
    if (block_hash == params.GetConsensus().hashGenesisBlock) {
        if (!fJustCheck)
            view.SetBestBlock(pindex->GetBlockHash());
        return true;
    }

    bool fScriptChecks = true;
    if (!m_chainman.AssumedValidBlock().IsNull()) {
        // We've been configured with the hash of a block which has been externally verified to have a valid history.
        // A suitable default value is included with the software and updated from time to time.  Because validity
        //  relative to a piece of software is an objective fact these defaults can be easily reviewed.
        // This setting doesn't force the selection of any particular chain but makes validating some faster by
        //  effectively caching the result of part of the verification.
        BlockMap::const_iterator it{m_blockman.m_block_index.find(m_chainman.AssumedValidBlock())};
        if (it != m_blockman.m_block_index.end()) {
            if (it->second.GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->GetAncestor(pindex->nHeight) == pindex &&
                m_chainman.m_best_header->nChainWork >= m_chainman.MinimumChainWork()) {
                // This block is a member of the assumed verified chain and an ancestor of the best header.
                // Script verification is skipped when connecting blocks under the
                // assumevalid block. Assuming the assumevalid block is valid this
                // is safe because block merkle hashes are still computed and checked,
                // Of course, if an assumed valid block is invalid due to false scriptSigs
                // this optimization would allow an invalid chain to be accepted.
                // The equivalent time check discourages hash power from extorting the network via DOS attack
                //  into accepting an invalid block through telling users they must manually set assumevalid.
                //  Requiring a software change or burying the invalid block, regardless of the setting, makes
                //  it hard to hide the implication of the demand.  This also avoids having release candidates
                //  that are hardly doing any signature verification at all in testing without having to
                //  artificially set the default assumed verified block further back.
                // The test against the minimum chain work prevents the skipping when denied access to any chain at
                //  least as good as the expected chain.
                fScriptChecks = (GetBlockProofEquivalentTime(*m_chainman.m_best_header, *pindex, *m_chainman.m_best_header, params.GetConsensus()) <= 60 * 60 * 24 * 7 * 2);
            }
        }
    }

    const auto time_1{SteadyClock::now()};
    m_chainman.time_check += time_1 - time_start;
    LogDebug(BCLog::BENCH, "    - Sanity checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_1 - time_start),
             Ticks<SecondsDouble>(m_chainman.time_check),
             Ticks<MillisecondsDouble>(m_chainman.time_check) / m_chainman.num_blocks_total);

    // Do not allow blocks that contain transactions which 'overwrite' older transactions,
    // unless those are already completely spent.
    // If such overwrites are allowed, coinbases and transactions depending upon those
    // can be duplicated to remove the ability to spend the first instance -- even after
    // being sent to another address.
    // See BIP30, CVE-2012-1909, and http://r6.ca/blog/20120206T005236Z.html for more information.
    // This rule was originally applied to all blocks with a timestamp after March 15, 2012, 0:00 UTC.
    // Now that the whole chain is irreversibly beyond that time it is applied to all blocks except the
    // two in the chain that violate it. This prevents exploiting the issue against nodes during their
    // initial block download.
    bool fEnforceBIP30 = !IsBIP30Repeat(*pindex);

    // Once BIP34 activated it was not possible to create new duplicate coinbases and thus other than starting
    // with the 2 existing duplicate coinbase pairs, not possible to create overwriting txs.  But by the
    // time BIP34 activated, in each of the existing pairs the duplicate coinbase had overwritten the first
    // before the first had been spent.  Since those coinbases are sufficiently buried it's no longer possible to create further
    // duplicate transactions descending from the known pairs either.
    // If we're on the known chain at height greater than where BIP34 activated, we can save the db accesses needed for the BIP30 check.

    // BIP34 requires that a block at height X (block X) has its coinbase
    // scriptSig start with a CScriptNum of X (indicated height X).  The above
    // logic of no longer requiring BIP30 once BIP34 activates is flawed in the
    // case that there is a block X before the BIP34 height of 227,931 which has
    // an indicated height Y where Y is greater than X.  The coinbase for block
    // X would also be a valid coinbase for block Y, which could be a BIP30
    // violation.  An exhaustive search of all mainnet coinbases before the
    // BIP34 height which have an indicated height greater than the block height
    // reveals many occurrences. The 3 lowest indicated heights found are
    // 209,921, 490,897, and 1,983,702 and thus coinbases for blocks at these 3
    // heights would be the first opportunity for BIP30 to be violated.

    // The search reveals a great many blocks which have an indicated height
    // greater than 1,983,702, so we simply remove the optimization to skip
    // BIP30 checking for blocks at height 1,983,702 or higher.  Before we reach
    // that block in another 25 years or so, we should take advantage of a
    // future consensus change to do a new and improved version of BIP34 that
    // will actually prevent ever creating any duplicate coinbases in the
    // future.
    static constexpr int BIP34_IMPLIES_BIP30_LIMIT = 1983702;

    // There is no potential to create a duplicate coinbase at block 209,921
    // because this is still before the BIP34 height and so explicit BIP30
    // checking is still active.

    // The final case is block 176,684 which has an indicated height of
    // 490,897. Unfortunately, this issue was not discovered until about 2 weeks
    // before block 490,897 so there was not much opportunity to address this
    // case other than to carefully analyze it and determine it would not be a
    // problem. Block 490,897 was, in fact, mined with a different coinbase than
    // block 176,684, but it is important to note that even if it hadn't been or
    // is remined on an alternate fork with a duplicate coinbase, we would still
    // not run into a BIP30 violation.  This is because the coinbase for 176,684
    // is spent in block 185,956 in transaction
    // d4f7fbbf92f4a3014a230b2dc70b8058d02eb36ac06b4a0736d9d60eaa9e8781.  This
    // spending transaction can't be duplicated because it also spends coinbase
    // 0328dd85c331237f18e781d692c92de57649529bd5edf1d01036daea32ffde29.  This
    // coinbase has an indicated height of over 4.2 billion, and wouldn't be
    // duplicatable until that height, and it's currently impossible to create a
    // chain that long. Nevertheless we may wish to consider a future soft fork
    // which retroactively prevents block 490,897 from creating a duplicate
    // coinbase. The two historical BIP30 violations often provide a confusing
    // edge case when manipulating the UTXO and it would be simpler not to have
    // another edge case to deal with.

    // testnet3 has no blocks before the BIP34 height with indicated heights
    // post BIP34 before approximately height 486,000,000. After block
    // 1,983,702 testnet3 starts doing unnecessary BIP30 checking again.
    assert(pindex->pprev);
    CBlockIndex* pindexBIP34height = pindex->pprev->GetAncestor(params.GetConsensus().BIP34Height);
    //Only continue to enforce if we're below BIP34 activation height or the block hash at that height doesn't correspond.
    fEnforceBIP30 = fEnforceBIP30 && (!pindexBIP34height || !(pindexBIP34height->GetBlockHash() == params.GetConsensus().BIP34Hash));

    // TODO: Remove BIP30 checking from block height 1,983,702 on, once we have a
    // consensus change that ensures coinbases at those heights cannot
    // duplicate earlier coinbases.
    if (fEnforceBIP30 || pindex->nHeight >= BIP34_IMPLIES_BIP30_LIMIT) {
        for (const auto& tx : block.vtx) {
            for (size_t o = 0; o < tx->vout.size(); o++) {
                if (view.HaveCoin(COutPoint(tx->GetHash(), o))) {
                    LogPrintf("ERROR: ConnectBlock(): tried to overwrite transaction\n");
                    return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-BIP30");
                }
            }
        }
    }

    // Enforce BIP68 (sequence locks)
    int nLockTimeFlags = 0;
    if (DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_CSV)) {
        nLockTimeFlags |= LOCKTIME_VERIFY_SEQUENCE;
    }

    // Get the script flags for this block
    unsigned int flags{GetBlockScriptFlags(*pindex, m_chainman)};

    const auto time_2{SteadyClock::now()};
    m_chainman.time_forks += time_2 - time_1;
    LogDebug(BCLog::BENCH, "    - Fork checks: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_2 - time_1),
             Ticks<SecondsDouble>(m_chainman.time_forks),
             Ticks<MillisecondsDouble>(m_chainman.time_forks) / m_chainman.num_blocks_total);

    CBlockUndo blockundo;

    // Precomputed transaction data pointers must not be invalidated
    // until after `control` has run the script checks (potentially
    // in multiple threads). Preallocate the vector size so a new allocation
    // doesn't invalidate pointers into the vector, and keep txsdata in scope
    // for as long as `control`.
    CCheckQueueControl<CScriptCheck> control(fScriptChecks && parallel_script_checks ? &m_chainman.GetCheckQueue() : nullptr);
    std::vector<PrecomputedTransactionData> txsdata(block.vtx.size());

    std::vector<int> prevheights;
    CAmount nFees = 0;
    int nInputs = 0;
    int64_t nSigOpsCost = 0;
    blockundo.vtxundo.reserve(block.vtx.size() - 1);
    for (unsigned int i = 0; i < block.vtx.size(); i++)
    {
        const CTransaction &tx = *(block.vtx[i]);

        nInputs += tx.vin.size();

        if (!tx.IsCoinBase())
        {
            CAmount txfee = 0;
            TxValidationState tx_state;
            if (!Consensus::CheckTxInputs(tx, tx_state, view, pindex->nHeight, txfee)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                            tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("%s: Consensus::CheckTxInputs: %s, %s\n", __func__, tx.GetHash().ToString(), state.ToString());
                return false;
            }
            nFees += txfee;
            if (!MoneyRange(nFees)) {
                LogPrintf("ERROR: %s: accumulated fee in the block out of range.\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-accumulated-fee-outofrange");
            }

            // Check that transaction is BIP68 final
            // BIP68 lock checks (as opposed to nLockTime checks) must
            // be in ConnectBlock because they require the UTXO set
            prevheights.resize(tx.vin.size());
            for (size_t j = 0; j < tx.vin.size(); j++) {
                prevheights[j] = view.AccessCoin(tx.vin[j].prevout).nHeight;
            }

            if (!SequenceLocks(tx, nLockTimeFlags, prevheights, *pindex)) {
                LogPrintf("ERROR: %s: contains a non-BIP68-final transaction\n", __func__);
                return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal");
            }
        }

        // GetTransactionSigOpCost counts 3 types of sigops:
        // * legacy (always)
        // * p2sh (when P2SH enabled in flags and excludes coinbase)
        // * witness (when witness enabled in flags and excludes coinbase)
        nSigOpsCost += GetTransactionSigOpCost(tx, view, flags);
        if (nSigOpsCost > MAX_BLOCK_SIGOPS_COST) {
            LogPrintf("ERROR: ConnectBlock(): too many sigops\n");
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-sigops");
        }

        if (!tx.IsCoinBase())
        {
            std::vector<CScriptCheck> vChecks;
            bool fCacheResults = fJustCheck; /* Don't cache results if we're actually connecting blocks (still consult the cache, though) */
            TxValidationState tx_state;
            if (fScriptChecks && !CheckInputScripts(tx, tx_state, view, flags, fCacheResults, fCacheResults, txsdata[i], m_chainman.m_validation_cache, parallel_script_checks ? &vChecks : nullptr)) {
                // Any transaction validation failure in ConnectBlock is a block consensus failure
                state.Invalid(BlockValidationResult::BLOCK_CONSENSUS,
                              tx_state.GetRejectReason(), tx_state.GetDebugMessage());
                LogError("ConnectBlock(): CheckInputScripts on %s failed with %s\n",
                    tx.GetHash().ToString(), state.ToString());
                return false;
            }
            control.Add(std::move(vChecks));
        }

        CTxUndo undoDummy;
        if (i > 0) {
            blockundo.vtxundo.emplace_back();
        }
        UpdateCoins(tx, view, i == 0 ? undoDummy : blockundo.vtxundo.back(), pindex->nHeight);
    }
    const auto time_3{SteadyClock::now()};
    m_chainman.time_connect += time_3 - time_2;
    LogDebug(BCLog::BENCH, "      - Connect %u transactions: %.2fms (%.3fms/tx, %.3fms/txin) [%.2fs (%.2fms/blk)]\n", (unsigned)block.vtx.size(),
             Ticks<MillisecondsDouble>(time_3 - time_2), Ticks<MillisecondsDouble>(time_3 - time_2) / block.vtx.size(),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_3 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_connect),
             Ticks<MillisecondsDouble>(m_chainman.time_connect) / m_chainman.num_blocks_total);

    CAmount blockReward = nFees + GetBlockSubsidy(pindex->nHeight, params.GetConsensus());
    if (block.vtx[0]->GetValueOut() > blockReward) {
        LogPrintf("ERROR: ConnectBlock(): coinbase pays too much (actual=%d vs limit=%d)\n", block.vtx[0]->GetValueOut(), blockReward);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-amount");
    }

    if (!control.Wait()) {
        LogPrintf("ERROR: %s: CheckQueue failed\n", __func__);
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "block-validation-failed");
    }
    const auto time_4{SteadyClock::now()};
    m_chainman.time_verify += time_4 - time_2;
    LogDebug(BCLog::BENCH, "    - Verify %u txins: %.2fms (%.3fms/txin) [%.2fs (%.2fms/blk)]\n", nInputs - 1,
             Ticks<MillisecondsDouble>(time_4 - time_2),
             nInputs <= 1 ? 0 : Ticks<MillisecondsDouble>(time_4 - time_2) / (nInputs - 1),
             Ticks<SecondsDouble>(m_chainman.time_verify),
             Ticks<MillisecondsDouble>(m_chainman.time_verify) / m_chainman.num_blocks_total);

    if (fJustCheck)
        return true;

    if (!m_blockman.WriteUndoDataForBlock(blockundo, state, *pindex)) {
        return false;
    }

    const auto time_5{SteadyClock::now()};
    m_chainman.time_undo += time_5 - time_4;
    LogDebug(BCLog::BENCH, "    - Write undo data: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_5 - time_4),
             Ticks<SecondsDouble>(m_chainman.time_undo),
             Ticks<MillisecondsDouble>(m_chainman.time_undo) / m_chainman.num_blocks_total);

    if (!pindex->IsValid(BLOCK_VALID_SCRIPTS)) {
        pindex->RaiseValidity(BLOCK_VALID_SCRIPTS);
        m_blockman.m_dirty_blockindex.insert(pindex);
    }

    // add this block to the view's block chain
    view.SetBestBlock(pindex->GetBlockHash());

    const auto time_6{SteadyClock::now()};
    m_chainman.time_index += time_6 - time_5;
    LogDebug(BCLog::BENCH, "    - Index writing: %.2fms [%.2fs (%.2fms/blk)]\n",
             Ticks<MillisecondsDouble>(time_6 - time_5),
             Ticks<SecondsDouble>(m_chainman.time_index),
             Ticks<MillisecondsDouble>(m_chainman.time_index) / m_chainman.num_blocks_total);

    TRACE6(validation, block_connected,
        block_hash.data(),
        pindex->nHeight,
        block.vtx.size(),
        nInputs,
        nSigOpsCost,
        time_5 - time_start // in microseconds (µs)
    );

    return true;
}